

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2convex_hull_query.cc
# Opt level: O0

void __thiscall
S2ConvexHullQuery::GetMonotoneChain
          (S2ConvexHullQuery *this,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *output)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  reference a;
  reference b;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  local_70;
  reference local_68;
  S2Point *p;
  iterator __end1;
  iterator __begin1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *__range1;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *local_18;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *output_local;
  S2ConvexHullQuery *this_local;
  
  local_18 = output;
  output_local = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)this;
  bVar1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::empty(output);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __end1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::begin(&this->points_);
    p = (S2Point *)
        std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end(&this->points_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
                                       *)&p), bVar1) {
      local_68 = __gnu_cxx::
                 __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
                 ::operator*(&__end1);
      while( true ) {
        sVar4 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(local_18);
        bVar1 = false;
        if (1 < sVar4) {
          local_70._M_current =
               (Vector3<double> *)
               std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end(local_18);
          a = __gnu_cxx::
              __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
              ::operator[](&local_70,-2);
          b = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::back(local_18);
          iVar2 = s2pred::Sign(a,b,local_68);
          bVar1 = iVar2 < 1;
        }
        if (!bVar1) break;
        std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::pop_back(local_18);
      }
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(local_18,local_68);
      __gnu_cxx::
      __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
      ::operator++(&__end1);
    }
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2convex_hull_query.cc"
             ,0xa2,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_30);
  poVar3 = std::operator<<(poVar3,"Check failed: output->empty() ");
  S2LogMessageVoidify::operator&(&local_19,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

void S2ConvexHullQuery::GetMonotoneChain(vector<S2Point>* output) {
  S2_DCHECK(output->empty());
  for (const S2Point& p : points_) {
    // Remove any points that would cause the chain to make a clockwise turn.
    while (output->size() >= 2 &&
           s2pred::Sign(output->end()[-2], output->back(), p) <= 0) {
      output->pop_back();
    }
    output->push_back(p);
  }
}